

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O2

uint __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
hash_key(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
         *this,basic_endpoint<asio::ip::udp> *k)

{
  uint64_t uVar1;
  
  uVar1 = HashUDPAddress(k);
  return (uint)((int)uVar1 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
}

Assistant:

inline unsigned hash_key(const Key& k) const
    {
        TONK_DEBUG_ASSERT((1U << (32U - m_hash_shift)) == m_values_count);

        unsigned hash = static_cast<unsigned>(m_hasher(k));

        // Fibonacci hashing
        hash = (2654435769U * hash) >> m_hash_shift;

        TONK_DEBUG_ASSERT(hash < m_values_count);
        return hash;
    }